

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_PopBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
~ParticleArrayTest_PopBack_Test
          (ParticleArrayTest_PopBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PopBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 33; i++)
        particles.pushBack(this->randomParticle());
    for (int i = particles.size(); i > 0; i--) {
        ParticleArray particlesCopy = particles;
        particles.popBack();
        ASSERT_EQ(particlesCopy.size(), particles.size() + 1);
        for (int j = 0; j < particles.size(); j++)
            EXPECT_TRUE(this->eqParticles_(particles[j], particlesCopy[j]));
    }
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}